

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# horizontal.cpp
# Opt level: O3

void __thiscall
cppurses::layout::Horizontal::collect_space
          (Horizontal *this,
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          *widgets,int width_left)

{
  size_t sVar1;
  undefined8 uVar2;
  Type TVar3;
  uint uVar4;
  long lVar5;
  ulong *puVar6;
  ulong uVar7;
  _Map_pointer ppuVar8;
  _Map_pointer ppuVar9;
  iterator __begin2;
  pointer pDVar10;
  _Elt_pointer puVar11;
  pointer pDVar12;
  Dimensions_reference *d_3;
  _Elt_pointer puVar13;
  long lVar14;
  ulong uVar15;
  Dimensions_reference *d_5;
  _Elt_pointer puVar16;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2;
  Dimensions_reference *d_2;
  _Map_pointer ppuVar17;
  _Map_pointer ppuVar18;
  pointer pDVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  *__range2_1;
  deque<unsigned_long,_std::allocator<unsigned_long>_> width_deductions;
  int local_f4;
  double local_f0;
  _Deque_base<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  double local_88;
  double dStack_80;
  ulong local_78;
  pointer *local_70;
  Horizontal *local_68;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_60;
  vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
  local_48;
  
  if (width_left == 0) {
    return;
  }
  pDVar10 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar19 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_f0 = 0.0;
  if (pDVar10 == pDVar19) {
    local_88 = 0.0;
    dStack_80 = 0.0;
  }
  else {
    lVar14 = 0;
    pDVar12 = pDVar10;
    do {
      TVar3 = (pDVar12->widget->width_policy).type_;
      if ((TVar3 < (Ignored|Minimum)) && ((0x4cU >> (TVar3 & 0x1f) & 1) != 0)) {
        lVar14 = lVar14 + (pDVar12->widget->width_policy).stretch_;
      }
      pDVar12 = pDVar12 + 1;
    } while (pDVar12 != pDVar19);
    auVar21._8_4_ = (int)((ulong)lVar14 >> 0x20);
    auVar21._0_8_ = lVar14;
    auVar21._12_4_ = 0x45300000;
    dStack_80 = auVar21._8_8_ - 1.9342813113834067e+25;
    local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
    if (pDVar10 != pDVar19) {
      local_f0 = 0.0;
      do {
        TVar3 = (pDVar10->widget->width_policy).type_;
        if ((TVar3 < (Ignored|Minimum)) && ((0x4cU >> (TVar3 & 0x1f) & 1) != 0)) {
          sVar1 = (pDVar10->widget->width_policy).stretch_;
          local_f0 = local_f0 +
                     1.0 / ((((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) -
                             1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
                           local_88);
        }
        pDVar10 = pDVar10 + 1;
      } while (pDVar10 != pDVar19);
    }
  }
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (ulong *)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (ulong *)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (ulong *)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (ulong *)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (ulong *)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (ulong *)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_68 = this;
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::_M_initialize_map(&local_d8,0);
  pDVar10 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pDVar19 = (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_f4 = width_left;
  if (pDVar10 != pDVar19) {
    local_70 = &local_48.
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar14 = 0x18;
    do {
      lVar5 = *(long *)((long)&pDVar10[-1].widget + lVar14);
      uVar4 = *(uint *)(lVar5 + 0x160);
      if ((uVar4 < 7) && ((0x4cU >> (uVar4 & 0x1f) & 1) != 0)) {
        uVar2 = *(undefined8 *)(lVar5 + 0x168);
        auVar22._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
        auVar22._8_4_ = (int)((ulong)uVar2 >> 0x20);
        auVar22._12_4_ = 0x45300000;
        dVar20 = ((1.0 / (((auVar22._8_8_ - 1.9342813113834067e+25) +
                          (auVar22._0_8_ - 4503599627370496.0)) / local_88)) / local_f0) *
                 (double)-width_left;
        local_78 = (ulong)dVar20;
        local_78 = (long)(dVar20 - 9.223372036854776e+18) & (long)local_78 >> 0x3f | local_78;
        if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
                    ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,&local_78);
        }
        else {
          *local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = local_78;
          local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur =
               local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
        }
        puVar6 = *(ulong **)((long)pDVar10 + lVar14 + -0x10);
        uVar7 = *puVar6;
        puVar11 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar11 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        uVar15 = *(ulong *)(*(long *)((long)&pDVar10[-1].widget + lVar14) + 0x178);
        if (uVar7 - puVar11[-1] < uVar15) {
          *puVar6 = uVar15;
          pDVar19 = (widgets->
                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pDVar12 = (widgets->
                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          pDVar10 = (pointer)((long)&pDVar19->widget + lVar14);
          if (pDVar10 != pDVar12) {
            memmove((void *)((long)&pDVar19[-1].widget + lVar14),pDVar10,
                    (long)pDVar12 + (-lVar14 - (long)pDVar19));
            pDVar12 = (widgets->
                      super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          }
          (widgets->
          super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          )._M_impl.super__Vector_impl_data._M_finish = pDVar12 + -1;
          std::
          vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ::vector(&local_48,widgets);
          collect_space(local_68,&local_48,((int)uVar7 - (int)uVar15) + width_left);
          local_60.
          super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_48.
               super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
               ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_0014265b;
        }
      }
      pDVar12 = (pointer)((long)&pDVar10->widget + lVar14);
      lVar14 = lVar14 + 0x18;
    } while (pDVar12 != pDVar19);
    pDVar10 = (widgets->
              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pDVar19 = (widgets->
              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    if (pDVar10 != pDVar19) {
      do {
        TVar3 = (pDVar10->widget->width_policy).type_;
        if ((TVar3 < (Ignored|Minimum)) && ((0x4cU >> (TVar3 & 0x1f) & 1) != 0)) {
          uVar7 = *pDVar10->width;
          uVar15 = uVar7 - *local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (uVar7 < *local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
            uVar15 = 0;
          }
          *pDVar10->width = uVar15;
          local_f4 = local_f4 + (int)*local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_d8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_d8._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
            local_d8._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_d8._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
        }
        pDVar10 = pDVar10 + 1;
      } while (pDVar10 != pDVar19);
    }
  }
  ppuVar9 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node;
  ppuVar8 = local_d8._M_impl.super__Deque_impl_data._M_start._M_node;
  puVar13 = local_d8._M_impl.super__Deque_impl_data._M_start._M_last;
  puVar16 = local_d8._M_impl.super__Deque_impl_data._M_start._M_first;
  puVar11 = local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_f4 != 0) {
    pDVar10 = (widgets->
              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pDVar19 = (widgets->
              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    local_f0 = 0.0;
    if (pDVar10 == pDVar19) {
      local_88 = 0.0;
      dStack_80 = 0.0;
    }
    else {
      lVar14 = 0;
      pDVar12 = pDVar10;
      do {
        if ((pDVar12->widget->width_policy).type_ == Expanding) {
          lVar14 = lVar14 + (pDVar12->widget->width_policy).stretch_;
        }
        pDVar12 = pDVar12 + 1;
      } while (pDVar12 != pDVar19);
      auVar23._8_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar23._0_8_ = lVar14;
      auVar23._12_4_ = 0x45300000;
      dStack_80 = auVar23._8_8_ - 1.9342813113834067e+25;
      local_88 = dStack_80 + ((double)CONCAT44(0x43300000,(int)lVar14) - 4503599627370496.0);
      if (pDVar10 != pDVar19) {
        local_f0 = 0.0;
        pDVar12 = pDVar10;
        do {
          if ((pDVar12->widget->width_policy).type_ == Expanding) {
            sVar1 = (pDVar12->widget->width_policy).stretch_;
            local_f0 = local_f0 +
                       1.0 / ((((double)CONCAT44(0x45300000,(int)(sVar1 >> 0x20)) -
                               1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) /
                             local_88);
          }
          pDVar12 = pDVar12 + 1;
        } while (pDVar12 != pDVar19);
      }
    }
    ppuVar17 = local_d8._M_impl.super__Deque_impl_data._M_start._M_node;
    if (local_d8._M_impl.super__Deque_impl_data._M_start._M_node <
        local_d8._M_impl.super__Deque_impl_data._M_finish._M_node) {
      do {
        ppuVar18 = ppuVar17 + 1;
        operator_delete(ppuVar17[1],0x200);
        ppuVar17 = ppuVar18;
      } while (ppuVar18 < ppuVar9);
      pDVar10 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar19 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = puVar11;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = puVar13;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = ppuVar8;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = puVar16;
    if (pDVar10 != pDVar19) {
      local_70 = &local_60.
                  super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lVar14 = 0x18;
      do {
        lVar5 = *(long *)((long)&pDVar10[-1].widget + lVar14);
        if (*(int *)(lVar5 + 0x160) == 4) {
          uVar2 = *(undefined8 *)(lVar5 + 0x168);
          auVar24._0_8_ = (double)CONCAT44(0x43300000,(int)uVar2);
          auVar24._8_4_ = (int)((ulong)uVar2 >> 0x20);
          auVar24._12_4_ = 0x45300000;
          dVar20 = ((1.0 / (((auVar24._8_8_ - 1.9342813113834067e+25) +
                            (auVar24._0_8_ - 4503599627370496.0)) / local_88)) / local_f0) *
                   (double)-local_f4;
          local_78 = (ulong)dVar20;
          local_78 = (long)(dVar20 - 9.223372036854776e+18) & (long)local_78 >> 0x3f | local_78;
          if (puVar11 == local_d8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
            std::deque<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_push_back_aux<unsigned_long>
                      ((deque<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d8,&local_78);
            puVar16 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_first;
          }
          else {
            *puVar11 = local_78;
            local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = puVar11 + 1;
          }
          puVar6 = *(ulong **)((long)pDVar10 + lVar14 + -0x10);
          uVar7 = *puVar6;
          puVar13 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur == puVar16) {
            puVar13 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          uVar15 = *(ulong *)(*(long *)((long)&pDVar10[-1].widget + lVar14) + 0x178);
          puVar11 = local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (uVar7 - puVar13[-1] < uVar15) {
            *puVar6 = uVar15;
            pDVar19 = (widgets->
                      super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pDVar12 = (widgets->
                      super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            pDVar10 = (pointer)((long)&pDVar19->widget + lVar14);
            if (pDVar10 != pDVar12) {
              memmove((void *)((long)&pDVar19[-1].widget + lVar14),pDVar10,
                      (long)pDVar12 + (-lVar14 - (long)pDVar19));
              pDVar12 = (widgets->
                        super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                        )._M_impl.super__Vector_impl_data._M_finish;
            }
            (widgets->
            super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            )._M_impl.super__Vector_impl_data._M_finish = pDVar12 + -1;
            std::
            vector<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
            ::vector(&local_60,widgets);
            collect_space(local_68,&local_60,local_f4 + ((int)uVar7 - (int)uVar15));
LAB_0014265b:
            if (local_60.
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_60.
                              super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)*local_70 -
                              (long)local_60.
                                    super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_00142673;
          }
        }
        pDVar12 = (pointer)((long)&pDVar10->widget + lVar14);
        lVar14 = lVar14 + 0x18;
      } while (pDVar12 != pDVar19);
      pDVar10 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pDVar19 = (widgets->
                super__Vector_base<cppurses::layout::Layout::Dimensions_reference,_std::allocator<cppurses::layout::Layout::Dimensions_reference>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pDVar10 != pDVar19) {
      do {
        if ((pDVar10->widget->width_policy).type_ == Expanding) {
          uVar7 = *pDVar10->width;
          uVar15 = uVar7 - *local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (uVar7 < *local_d8._M_impl.super__Deque_impl_data._M_start._M_cur) {
            uVar15 = 0;
          }
          *pDVar10->width = uVar15;
          if (local_d8._M_impl.super__Deque_impl_data._M_start._M_cur ==
              local_d8._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
            operator_delete(local_d8._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
            local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_node[1];
            local_d8._M_impl.super__Deque_impl_data._M_start._M_last =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 0x40;
            local_d8._M_impl.super__Deque_impl_data._M_start._M_first =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_d8._M_impl.super__Deque_impl_data._M_start._M_node =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_node + 1;
          }
          else {
            local_d8._M_impl.super__Deque_impl_data._M_start._M_cur =
                 local_d8._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
          }
        }
        pDVar10 = pDVar10 + 1;
      } while (pDVar10 != pDVar19);
    }
  }
LAB_00142673:
  std::_Deque_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Deque_base(&local_d8);
  return;
}

Assistant:

void Horizontal::collect_space(std::vector<Dimensions_reference> widgets,
                               int width_left) {
    if (width_left == 0) {
        return;
    }
    // Find total stretch of first group
    std::size_t total_stretch{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Find total of inverse of percentages
    double total_inverse{0};
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            total_inverse += 1 / (d.widget->width_policy.stretch() /
                                  static_cast<double>(total_stretch));
        }
    }

    // Calculate new widths of widgets in new group, if any go under min_width
    // then assign min value and recurse without that widget in vector.
    std::deque<std::size_t> width_deductions;
    int index{0};
    auto to_collect = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            width_deductions.push_back(
                ((1 / (d.widget->width_policy.stretch() /
                       static_cast<double>(total_stretch))) /
                 static_cast<double>(total_inverse)) *
                (to_collect * -1));
            if ((*d.width - width_deductions.back()) <
                d.widget->width_policy.min_size()) {
                width_left += *d.width - d.widget->width_policy.min_size();
                *d.width = d.widget->width_policy.min_size();
                widgets.erase(std::begin(widgets) + index);
                return collect_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Maximum ||
            policy == Size_policy::Preferred ||
            policy == Size_policy::Ignored) {
            if (*d.width >= width_deductions.front()) {
                *d.width -= width_deductions.front();
            } else {
                *d.width = 0;
            }
            width_left += width_deductions.front();
            width_deductions.pop_front();
        }
    }

    // SECOND GROUP - duplicate of above dependent on Policies to work with.
    if (width_left == 0) {
        return;
    }
    // Find total stretch
    total_stretch = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            total_stretch += d.widget->width_policy.stretch();
        }
    }

    // Find total of inverse of percentages
    total_inverse = 0;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            total_inverse += 1 / (d.widget->width_policy.stretch() /
                                  static_cast<double>(total_stretch));
        }
    }

    // Calculate new widths of widgets in new group, if any go over max_width
    // then assign max value and recurse without that widget in vector.
    width_deductions.clear();
    index = 0;
    to_collect = width_left;
    for (const Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            width_deductions.push_back(
                ((1 / (d.widget->width_policy.stretch() /
                       static_cast<double>(total_stretch))) /
                 static_cast<double>(total_inverse)) *
                (to_collect * -1));
            if ((*d.width - width_deductions.back()) <
                d.widget->width_policy.min_size()) {
                width_left += *d.width - d.widget->width_policy.min_size();
                *d.width = d.widget->width_policy.min_size();
                widgets.erase(std::begin(widgets) + index);
                return collect_space(widgets, width_left);
            }
        }
        ++index;
    }

    // If it has gotten this far, no widgets were over space, assign calculated
    // values
    for (Dimensions_reference& d : widgets) {
        auto policy = d.widget->width_policy.type();
        if (policy == Size_policy::Expanding) {
            if (*d.width >= width_deductions.front()) {
                *d.width -= width_deductions.front();
            } else {
                *d.width = 0;
            }
            width_left += width_deductions.front();
            width_deductions.pop_front();
        }
    }
    // Change this to distribute the space, it might not be too small
    if (width_left != 0) {
        return;
    }
}